

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionIDTests::TestlessThanFixturelessThan::TestlessThanFixturelessThan
          (TestlessThanFixturelessThan *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"lessThan","SessionIDTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionIDTestCase.cpp"
             ,0x38);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031ed10;
  return;
}

Assistant:

TEST_FIXTURE(lessThanFixture,lessThan)
{
  CHECK( !( less1 < less1 ) );
  CHECK( less1 < less2 );
  CHECK( less1 < less3 );
  CHECK( less1 < less4 );
  CHECK( less1 < less5 );
  CHECK( less1 < less6 );

  CHECK( !( less2 < less1 ) );
  CHECK( !( less2 < less2 ) );
  CHECK( less2 < less3 );
  CHECK( less2 < less4 );
  CHECK( less2 < less5 );
  CHECK( less2 < less6 );

  CHECK( !( less3 < less1 ) );
  CHECK( !( less3 < less2 ) );
  CHECK( !( less3 < less3 ) );
  CHECK( less3 < less4 );
  CHECK( less3 < less5 );
  CHECK( less3 < less6 );

  CHECK( !( less4 < less1 ) );
  CHECK( !( less4 < less2 ) );
  CHECK( !( less4 < less3 ) );
  CHECK( !( less4 < less4 ) );
  CHECK( less4 < less5 );
  CHECK( less4 < less6 );

  CHECK( !( less5 < less1 ) );
  CHECK( !( less5 < less2 ) );
  CHECK( !( less5 < less3 ) );
  CHECK( !( less5 < less4 ) );
  CHECK( !( less5 < less5 ) );
  CHECK( less5 < less6 );

  CHECK( !( less6 < less1 ) );
  CHECK( !( less6 < less2 ) );
  CHECK( !( less6 < less3 ) );
  CHECK( !( less6 < less4 ) );
  CHECK( !( less6 < less5 ) );
  CHECK( !( less6 < less6 ) );
}